

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O3

void * mi_heap_malloc(mi_heap_t *heap,size_t size)

{
  long lVar1;
  undefined8 *puVar2;
  void *pvVar3;
  
  if (size < 0x401) {
    lVar1 = *(long *)((long)heap->pages_free_direct + (size + 7 & 0xfffffffffffffff8));
    puVar2 = *(undefined8 **)(lVar1 + 0x10);
    if (puVar2 != (undefined8 *)0x0) {
      *(undefined8 *)(lVar1 + 0x10) = *puVar2;
      *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
      return puVar2;
    }
  }
  pvVar3 = _mi_malloc_generic(heap,size,false,0);
  return pvVar3;
}

Assistant:

extern inline void* _mi_heap_malloc_zero_ex(mi_heap_t* heap, size_t size, bool zero, size_t huge_alignment) mi_attr_noexcept {
  // fast path for small objects
  if mi_likely(size <= MI_SMALL_SIZE_MAX) {
    mi_assert_internal(huge_alignment == 0);
    return mi_heap_malloc_small_zero(heap, size, zero);
  }
  #if MI_GUARDED
  else if (huge_alignment==0 && mi_heap_malloc_use_guarded(heap,size)) {
    return _mi_heap_malloc_guarded(heap, size, zero);
  }
  #endif
  else {
    // regular allocation
    mi_assert(heap!=NULL);
    mi_assert(heap->thread_id == 0 || heap->thread_id == _mi_thread_id());   // heaps are thread local
    void* const p = _mi_malloc_generic(heap, size + MI_PADDING_SIZE, zero, huge_alignment);  // note: size can overflow but it is detected in malloc_generic
    mi_track_malloc(p,size,zero);

    #if MI_DEBUG>3
    if (p != NULL && zero) {
      mi_assert_expensive(mi_mem_is_zero(p, size));
    }
    #endif
    return p;
  }
}